

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str_hash.c
# Opt level: O0

StrHash hash_sparse_sse42(uint64_t seed,char *str,MSize len)

{
  MSize len_local;
  char *str_local;
  uint64_t seed_local;
  
  if ((len < 4) || (0x7f < len)) {
    seed_local._4_4_ = hash_sparse_1_4(seed,str,len);
  }
  else if (len < 0x10) {
    seed_local._4_4_ = hash_sparse_4_16(seed,str,len);
  }
  else {
    seed_local._4_4_ = hash_16_128(seed,str,len);
  }
  return seed_local._4_4_;
}

Assistant:

static StrHash hash_sparse_sse42(uint64_t seed, const char* str, MSize len)
{
  if (len < 4 || len >= 128)
    return hash_sparse_1_4(seed, str, len);

  if (len >= 16) /* [16, 128) */
    return hash_16_128(seed, str, len);

  /* [4, 16) */
  return hash_sparse_4_16(seed, str, len);
}